

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat.cpp
# Opt level: O1

void embree::Stat::print(ostream *cout)

{
  ulong uVar1;
  char cVar2;
  unkuint9 Var3;
  unkuint9 Var4;
  unkuint9 Var5;
  unkuint9 Var6;
  unkuint9 Var7;
  unkuint9 Var8;
  unkuint9 Var9;
  unkuint9 Var10;
  unkuint9 Var11;
  unkuint9 Var12;
  unkuint9 Var13;
  unkuint9 Var14;
  unkuint9 Var15;
  unkuint9 Var16;
  size_t i;
  ostream *poVar17;
  long lVar18;
  ulong uVar19;
  size_t i_1;
  ulong uVar20;
  float local_6c;
  
  std::__ostream_insert<char,std::char_traits<char>>(cout,"--------- ABSOLUTE ---------",0x1c);
  cVar2 = (char)cout;
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"  #normal_travs   = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)DAT_022260d8 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #nodes        = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)DAT_022260e0 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #nodes_xfm    = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)DAT_02226320 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #leaves       = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)DAT_022260e8 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prims        = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)DAT_022260f0 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prim_hits    = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)DAT_022260f8 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #stack nodes  = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)_DAT_02226318 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #stack pop    = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)DAT_02226310 * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  uVar20 = 0;
  uVar19 = 0;
  lVar18 = 0;
  do {
    uVar20 = uVar20 + (&DAT_02226100)[lVar18];
    uVar19 = uVar19 + (&DAT_02226100)[lVar18] * lVar18;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x41);
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #hit_boxes    = ",0x14);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," (total) distribution: ",0x17);
  local_6c = 0.0;
  lVar18 = 0;
  do {
    uVar1 = (&DAT_02226100)[lVar18];
    std::__ostream_insert<char,std::char_traits<char>>(cout,"[",1);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] ",2);
    poVar17 = std::ostream::_M_insert<double>((double)(((float)uVar1 * 100.0) / (float)uVar20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    local_6c = local_6c + ((float)lVar18 * (float)(ulong)(&DAT_02226100)[lVar18]) / (float)uVar20;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x41);
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    average = ",0xe);
  poVar17 = std::ostream::_M_insert<double>((double)local_6c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  lVar18 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(cout,"[",1);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] ",2);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(((float)lVar18 * (float)(ulong)(&DAT_02226100)[lVar18] * 100.0) /
                                 (float)uVar19));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x41);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (DAT_02226328 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(cout,"  #shadow_travs = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)DAT_02226328 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #nodes      = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)DAT_02226330 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #nodes_xfm  = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)DAT_02226570 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #leaves     = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)DAT_02226338 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prims      = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)DAT_02226340 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prim_hits  = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)DAT_02226348 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #stack nodes = ",0x13);
    poVar17 = std::ostream::_M_insert<double>((double)_DAT_02226568 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #stack pop   = ",0x13);
    poVar17 = std::ostream::_M_insert<double>((double)_DAT_02226560 * 1e-06);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"M",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    uVar20 = 0;
    uVar19 = 0;
    lVar18 = 0;
    do {
      uVar20 = uVar20 + *(long *)(&DAT_02226350 + lVar18 * 8);
      uVar19 = uVar19 + *(long *)(&DAT_02226350 + lVar18 * 8) * lVar18;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x41);
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #hit_boxes    = ",0x14);
    lVar18 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"[",1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] ",2);
      poVar17 = std::ostream::_M_insert<double>
                          ((double)(((float)*(ulong *)(&DAT_02226350 + lVar18 * 8) * 100.0) /
                                   (float)uVar20));
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x41);
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    lVar18 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"[",1);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] ",2);
      poVar17 = std::ostream::_M_insert<double>
                          ((double)(((float)lVar18 *
                                    (float)*(ulong *)(&DAT_02226350 + lVar18 * 8) * 100.0) /
                                   (float)uVar19));
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x41);
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"--------- PER TRAVERSAL ---------",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  Var3 = (unkuint9)_DAT_022259e8;
  Var4 = (unkuint9)instance;
  Var5 = (unkuint9)DAT_022259f0;
  Var6 = (unkuint9)DAT_02225300;
  Var7 = (unkuint9)DAT_02225c30;
  Var8 = (unkuint9)DAT_02225540;
  Var9 = (unkuint9)DAT_022259f8;
  Var10 = (unkuint9)DAT_02225308;
  Var11 = (unkuint9)DAT_02225a00;
  Var12 = (unkuint9)DAT_02225310;
  Var13 = (unkuint9)DAT_02225a08;
  Var14 = (unkuint9)DAT_02225318;
  Var15 = (unkuint9)DAT_02225c20;
  Var16 = (unkuint9)DAT_02225530;
  std::__ostream_insert<char,std::char_traits<char>>(cout,"  #normal_travs   = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_022260d8 / (float)DAT_022260d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)(unkint9)Var3 / (float)(unkint9)Var4) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #nodes        = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_022260e0 / (float)DAT_022260d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)(unkint9)Var5 / (float)(unkint9)Var6) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #node_xfm     = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226320 / (float)DAT_022260d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)(unkint9)Var7 / (float)(unkint9)Var8) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #leaves       = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_022260e8 / (float)DAT_022260d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)(unkint9)Var9 / (float)(unkint9)Var10) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prims        = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_022260f0 / (float)DAT_022260d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)(unkint9)Var11 / (float)(unkint9)Var12) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prim_hits    = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_022260f8 / (float)DAT_022260d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)(unkint9)Var13 / (float)(unkint9)Var14) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"    #stack_pop    = ",0x14);
  poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226310 / (float)DAT_022260d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)(unkint9)Var15 / (float)(unkint9)Var16) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  if (DAT_02225548 != 0) {
    Var3 = (unkuint9)DAT_02225c38;
    Var4 = (unkuint9)DAT_02225548;
    Var5 = (unkuint9)DAT_02225c40;
    Var6 = (unkuint9)DAT_02225550;
    Var7 = (unkuint9)DAT_02225e80;
    Var8 = (unkuint9)DAT_02225790;
    Var9 = (unkuint9)DAT_02225c48;
    Var10 = (unkuint9)DAT_02225558;
    Var11 = (unkuint9)DAT_02225c50;
    Var12 = (unkuint9)DAT_02225560;
    Var13 = (unkuint9)DAT_02225c58;
    Var14 = (unkuint9)DAT_02225568;
    std::__ostream_insert<char,std::char_traits<char>>(cout,"  #shadow_travs = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226328 / (float)DAT_02226328));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(((float)(unkint9)Var3 / (float)(unkint9)Var4) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #nodes      = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226330 / (float)DAT_02226328));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(((float)(unkint9)Var5 / (float)(unkint9)Var6) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #nodes_xfm  = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226570 / (float)DAT_02226328));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(((float)(unkint9)Var7 / (float)(unkint9)Var8) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #leaves     = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226338 / (float)DAT_02226328));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(((float)(unkint9)Var9 / (float)(unkint9)Var10) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prims      = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226340 / (float)DAT_02226328));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(((float)(unkint9)Var11 / (float)(unkint9)Var12) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(cout,"    #prim_hits  = ",0x12);
    poVar17 = std::ostream::_M_insert<double>((double)((float)DAT_02226348 / (float)DAT_02226328));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(((float)(unkint9)Var13 / (float)(unkint9)Var14) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"% active",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"--------- USER ---------",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  lVar18 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(cout,"#user",5);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," = ",3);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)((float)(ulong)(&DAT_022267c8)[lVar18] /
                                 (float)(DAT_02225548 + instance)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," per traversal",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    lVar18 = lVar18 + 1;
  } while (lVar18 != 10);
  std::__ostream_insert<char,std::char_traits<char>>(cout,"#user5/user3 ",0xd);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)DAT_022267f0 * 100.0) / (float)DAT_022267e0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"#user6/user3 ",0xd);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)DAT_022267f8 * 100.0) / (float)DAT_022267e0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(cout,"#user7/user3 ",0xd);
  poVar17 = std::ostream::_M_insert<double>
                      ((double)(((float)DAT_02226800 * 100.0) / (float)DAT_022267e0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Stat::print(embree_ostream cout)
  {
    Counters& cntrs = instance.cntrs;
    Counters::Data& data = instance.cntrs.code;
    //Counters::Data& data = instance.cntrs.active;

    /* print absolute numbers */
    cout << "--------- ABSOLUTE ---------" << std::endl;
    cout << "  #normal_travs   = " << float(data.normal.travs            )*1E-6 << "M" << std::endl;
    cout << "    #nodes        = " << float(data.normal.trav_nodes       )*1E-6 << "M" << std::endl;
    cout << "    #nodes_xfm    = " << float(data.normal.trav_xfm_nodes   )*1E-6 << "M" << std::endl;
    cout << "    #leaves       = " << float(data.normal.trav_leaves      )*1E-6 << "M" << std::endl;
    cout << "    #prims        = " << float(data.normal.trav_prims       )*1E-6 << "M" << std::endl;
    cout << "    #prim_hits    = " << float(data.normal.trav_prim_hits   )*1E-6 << "M" << std::endl;

    cout << "    #stack nodes  = " << float(data.normal.trav_stack_nodes )*1E-6 << "M" << std::endl;
    cout << "    #stack pop    = " << float(data.normal.trav_stack_pop )*1E-6 << "M" << std::endl;

    size_t normal_box_hits = 0;
    size_t weighted_box_hits = 0;
    for (size_t i=0;i<SIZE_HISTOGRAM;i++) { 
      normal_box_hits += data.normal.trav_hit_boxes[i];
      weighted_box_hits += data.normal.trav_hit_boxes[i]*i;
    }
    cout << "    #hit_boxes    = " << normal_box_hits << " (total) distribution: ";
    float average = 0.0f;
    for (size_t i=0;i<SIZE_HISTOGRAM;i++) 
    {
      float value = 100.0f * data.normal.trav_hit_boxes[i] / normal_box_hits;
      cout << "[" << i << "] " << value << " ";
      average += (float)i*data.normal.trav_hit_boxes[i] / normal_box_hits;
    }
    cout << "    average = " << average << std::endl;
    for (size_t i=0;i<SIZE_HISTOGRAM;i++) cout << "[" << i << "] " << 100.0f * data.normal.trav_hit_boxes[i]*i / weighted_box_hits << " ";
    cout << std::endl;

    if (data.shadow.travs) {
      cout << "  #shadow_travs = " << float(data.shadow.travs         )*1E-6 << "M" << std::endl;
      cout << "    #nodes      = " << float(data.shadow.trav_nodes    )*1E-6 << "M" << std::endl;
      cout << "    #nodes_xfm  = " << float(data.shadow.trav_xfm_nodes)*1E-6 << "M" << std::endl;
      cout << "    #leaves     = " << float(data.shadow.trav_leaves   )*1E-6 << "M" << std::endl;
      cout << "    #prims      = " << float(data.shadow.trav_prims    )*1E-6 << "M" << std::endl;
      cout << "    #prim_hits  = " << float(data.shadow.trav_prim_hits)*1E-6 << "M" << std::endl;

      cout << "    #stack nodes = " << float(data.shadow.trav_stack_nodes )*1E-6 << "M" << std::endl;
      cout << "    #stack pop   = " << float(data.shadow.trav_stack_pop )*1E-6 << "M" << std::endl;

      size_t shadow_box_hits = 0;
      size_t weighted_shadow_box_hits = 0;

      for (size_t i=0;i<SIZE_HISTOGRAM;i++) {        
        shadow_box_hits += data.shadow.trav_hit_boxes[i];
        weighted_shadow_box_hits += data.shadow.trav_hit_boxes[i]*i;
      }
      cout << "    #hit_boxes    = ";
      for (size_t i=0;i<SIZE_HISTOGRAM;i++) cout << "[" << i << "] " << 100.0f * data.shadow.trav_hit_boxes[i] / shadow_box_hits << " ";
      cout << std::endl;
      for (size_t i=0;i<SIZE_HISTOGRAM;i++) cout << "[" << i << "] " << 100.0f * data.shadow.trav_hit_boxes[i]*i / weighted_shadow_box_hits << " ";
      cout << std::endl;
    }
    cout << std::endl;

    /* print per traversal numbers */
    cout << "--------- PER TRAVERSAL ---------" << std::endl;
    float active_normal_travs       = float(cntrs.active.normal.travs      )/float(cntrs.all.normal.travs      );
    float active_normal_trav_nodes  = float(cntrs.active.normal.trav_nodes )/float(cntrs.all.normal.trav_nodes );
    float active_normal_trav_xfm_nodes  = float(cntrs.active.normal.trav_xfm_nodes )/float(cntrs.all.normal.trav_xfm_nodes );
    float active_normal_trav_leaves = float(cntrs.active.normal.trav_leaves)/float(cntrs.all.normal.trav_leaves);
    float active_normal_trav_prims   = float(cntrs.active.normal.trav_prims  )/float(cntrs.all.normal.trav_prims  );
    float active_normal_trav_prim_hits = float(cntrs.active.normal.trav_prim_hits  )/float(cntrs.all.normal.trav_prim_hits  );
    float active_normal_trav_stack_pop = float(cntrs.active.normal.trav_stack_pop  )/float(cntrs.all.normal.trav_stack_pop  );

    cout << "  #normal_travs   = " << float(cntrs.code.normal.travs      )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_travs       << "% active" << std::endl;
    cout << "    #nodes        = " << float(cntrs.code.normal.trav_nodes )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_nodes  << "% active" << std::endl;
    cout << "    #node_xfm     = " << float(cntrs.code.normal.trav_xfm_nodes )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_xfm_nodes  << "% active" << std::endl;
    cout << "    #leaves       = " << float(cntrs.code.normal.trav_leaves)/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_leaves << "% active" << std::endl;
    cout << "    #prims        = " << float(cntrs.code.normal.trav_prims  )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_prims   << "% active" << std::endl;
    cout << "    #prim_hits    = " << float(cntrs.code.normal.trav_prim_hits  )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_prim_hits   << "% active" << std::endl;
    cout << "    #stack_pop    = " << float(cntrs.code.normal.trav_stack_pop  )/float(cntrs.code.normal.travs) << ", " << 100.0f*active_normal_trav_stack_pop   << "% active" << std::endl;

    if (cntrs.all.shadow.travs) {
      float active_shadow_travs       = float(cntrs.active.shadow.travs      )/float(cntrs.all.shadow.travs      );
      float active_shadow_trav_nodes  = float(cntrs.active.shadow.trav_nodes )/float(cntrs.all.shadow.trav_nodes );
      float active_shadow_trav_xfm_nodes  = float(cntrs.active.shadow.trav_xfm_nodes )/float(cntrs.all.shadow.trav_xfm_nodes );
      float active_shadow_trav_leaves = float(cntrs.active.shadow.trav_leaves)/float(cntrs.all.shadow.trav_leaves);
      float active_shadow_trav_prims   = float(cntrs.active.shadow.trav_prims  )/float(cntrs.all.shadow.trav_prims  );
      float active_shadow_trav_prim_hits = float(cntrs.active.shadow.trav_prim_hits  )/float(cntrs.all.shadow.trav_prim_hits  );

      cout << "  #shadow_travs = " << float(cntrs.code.shadow.travs      )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_travs       << "% active" << std::endl;
      cout << "    #nodes      = " << float(cntrs.code.shadow.trav_nodes )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_nodes  << "% active" << std::endl;
      cout << "    #nodes_xfm  = " << float(cntrs.code.shadow.trav_xfm_nodes )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_xfm_nodes  << "% active" << std::endl;
      cout << "    #leaves     = " << float(cntrs.code.shadow.trav_leaves)/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_leaves << "% active" << std::endl;
      cout << "    #prims      = " << float(cntrs.code.shadow.trav_prims  )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_prims   << "% active" << std::endl;
      cout << "    #prim_hits  = " << float(cntrs.code.shadow.trav_prim_hits  )/float(cntrs.code.shadow.travs) << ", " << 100.0f*active_shadow_trav_prim_hits   << "% active" << std::endl;

    }
    cout << std::endl;

     /* print user counters for performance tuning */
    cout << "--------- USER ---------" << std::endl;
    for (size_t i=0; i<10; i++)
      cout << "#user" << i << " = " << float(cntrs.user[i])/float(cntrs.all.normal.travs+cntrs.all.shadow.travs) << " per traversal" << std::endl;

    cout << "#user5/user3 " << 100.0f*float(cntrs.user[5])/float(cntrs.user[3]) << "%" << std::endl;
    cout << "#user6/user3 " << 100.0f*float(cntrs.user[6])/float(cntrs.user[3]) << "%" << std::endl;
    cout << "#user7/user3 " << 100.0f*float(cntrs.user[7])/float(cntrs.user[3]) << "%" << std::endl;
    cout << std::endl;
  }